

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCoordinatesTests.cpp
# Opt level: O3

bool vkt::tessellation::anon_unknown_0::oneWayComparePointSets
               (TestLog *log,Surface *errorDst,TessPrimitiveType primitiveType,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *subset,
               vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> *superset,
               char *subsetName,char *supersetName,RGBA *errorColor)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  char *pcVar4;
  pointer pVVar5;
  ulong uVar6;
  pointer pVVar7;
  Vector<float,_3> *pVVar8;
  size_t sVar9;
  pointer pVVar10;
  pointer pVVar11;
  pointer pVVar12;
  ulong uVar13;
  __normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
  __i;
  long lVar14;
  pointer pVVar15;
  uint uVar16;
  Vector<float,_3> *pVVar17;
  long lVar18;
  uint uVar19;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  bool bVar24;
  Vector<bool,_3> res_3;
  Vec3 matchMax;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> supersetSorted;
  Vec3 matchMin;
  char local_214 [4];
  char local_210 [4];
  int local_20c;
  pointer local_208;
  TessPrimitiveType local_1fc;
  float local_1f8 [4];
  TestLog *local_1e8;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_1e0;
  char *local_1c8;
  Surface *local_1c0;
  long local_1b8;
  undefined1 local_1b0 [8];
  float local_1a8;
  undefined4 uStack_1a4;
  ios_base local_138 [264];
  int iVar20;
  
  local_1fc = primitiveType;
  local_1e8 = log;
  local_1c8 = subsetName;
  local_1c0 = errorDst;
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::vector
            (&local_1e0,superset);
  pVVar12 = local_1e0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  pVVar10 = local_1e0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_1e0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_1e0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar14 = (long)local_1e0.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_1e0.
                   super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = (lVar14 >> 2) * -0x5555555555555555;
    lVar23 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar23 == 0; lVar23 = lVar23 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<tcu::Vector<float,3>*,std::vector<tcu::Vector<float,3>,std::allocator<tcu::Vector<float,3>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(tcu::Vector<float,3>const&,tcu::Vector<float,3>const&)>>
              ((__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                )local_1e0.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<tcu::Vector<float,_3>_*,_std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>_>
                )local_1e0.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish,(ulong)(((uint)lVar23 ^ 0x3f) * 2) ^ 0x7e
               ,(_Iter_comp_iter<bool_(*)(const_tcu::Vector<float,_3>_&,_const_tcu::Vector<float,_3>_&)>
                 )0x7796b5);
    if (lVar14 < 0xc1) {
      pVVar17 = pVVar10 + 1;
      if (pVVar17 != pVVar12) {
        uVar6 = 0xc;
        pVVar15 = pVVar10;
        do {
          fVar1 = pVVar17->m_data[0];
          if (pVVar10->m_data[0] <= fVar1) {
            uVar3 = *(undefined8 *)(pVVar17->m_data + 1);
            fVar2 = pVVar15->m_data[0];
            pVVar8 = pVVar17;
            while (fVar1 < fVar2) {
              pVVar8->m_data[2] = pVVar8[-1].m_data[2];
              *(undefined8 *)pVVar8->m_data = *(undefined8 *)pVVar8[-1].m_data;
              fVar2 = pVVar8[-2].m_data[0];
              pVVar8 = pVVar8 + -1;
            }
            pVVar8->m_data[0] = fVar1;
            *(undefined8 *)(pVVar8->m_data + 1) = uVar3;
          }
          else {
            local_1a8 = pVVar17->m_data[2];
            local_1b0 = *(undefined1 (*) [8])pVVar17->m_data;
            if (pVVar17 != pVVar10 && -1 < (long)pVVar17 - (long)pVVar10) {
              uVar13 = uVar6 / 0xc + 1;
              pVVar8 = pVVar15;
              do {
                pVVar8[1].m_data[2] = pVVar8->m_data[2];
                *(undefined8 *)pVVar8[1].m_data = *(undefined8 *)pVVar8->m_data;
                uVar13 = uVar13 - 1;
                pVVar8 = pVVar8 + -1;
              } while (1 < uVar13);
            }
            pVVar10->m_data[2] = local_1a8;
            *(undefined1 (*) [8])pVVar10->m_data = local_1b0;
          }
          pVVar17 = pVVar17 + 1;
          uVar6 = uVar6 + 0xc;
          pVVar15 = pVVar15 + 1;
        } while (pVVar17 != pVVar12);
      }
    }
    else {
      pVVar15 = pVVar10 + 0x10;
      local_208 = pVVar10 + 1;
      lVar23 = 0;
      pVVar5 = local_208;
      pVVar11 = pVVar10;
      do {
        pVVar7 = pVVar5;
        fVar1 = pVVar11[1].m_data[0];
        if (pVVar10->m_data[0] <= fVar1) {
          uVar3 = *(undefined8 *)(pVVar7->m_data + 1);
          fVar2 = pVVar11->m_data[0];
          pVVar5 = pVVar7;
          while (fVar1 < fVar2) {
            pVVar5->m_data[2] = pVVar5[-1].m_data[2];
            *(undefined8 *)pVVar5->m_data = *(undefined8 *)pVVar5[-1].m_data;
            fVar2 = pVVar5[-2].m_data[0];
            pVVar5 = pVVar5 + -1;
          }
          pVVar5->m_data[0] = fVar1;
          *(undefined8 *)(pVVar5->m_data + 1) = uVar3;
        }
        else {
          local_1a8 = pVVar7->m_data[2];
          local_1b0 = *(undefined1 (*) [8])pVVar7->m_data;
          if (pVVar7 != pVVar10 && -1 < (long)pVVar7 - (long)pVVar10) {
            memmove(local_208,pVVar10,lVar23 * 0xc + 0xc);
          }
          pVVar10->m_data[2] = local_1a8;
          *(undefined1 (*) [8])pVVar10->m_data = local_1b0;
        }
        lVar23 = lVar23 + 1;
        pVVar5 = pVVar7 + 1;
        pVVar11 = pVVar7;
      } while (pVVar7 + 1 != pVVar15);
      for (; pVVar15 != pVVar12; pVVar15 = pVVar15 + 1) {
        fVar1 = pVVar15->m_data[0];
        uVar3 = *(undefined8 *)(pVVar15->m_data + 1);
        fVar2 = pVVar15[-1].m_data[0];
        pVVar10 = pVVar15;
        while (fVar1 < fVar2) {
          pVVar10->m_data[2] = pVVar10[-1].m_data[2];
          *(undefined8 *)pVVar10->m_data = *(undefined8 *)pVVar10[-1].m_data;
          fVar2 = pVVar10[-2].m_data[0];
          pVVar10 = pVVar10 + -1;
        }
        pVVar10->m_data[0] = fVar1;
        *(undefined8 *)(pVVar10->m_data + 1) = uVar3;
      }
    }
  }
  pVVar10 = (subset->
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pVVar12 = (subset->
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  if ((int)((ulong)((long)pVVar12 - (long)pVVar10) >> 2) * -0x55555555 < 1) {
    bVar24 = true;
  }
  else {
    lVar14 = 0;
    lVar23 = 0;
    local_20c = 0;
    do {
      local_208 = pVVar10 + lVar23;
      local_1a8 = 0.0;
      local_1b0 = (undefined1  [8])0x0;
      lVar18 = 0;
      do {
        *(float *)(local_1b0 + lVar18 * 4) =
             *(float *)((long)pVVar10->m_data + lVar18 * 4 + lVar14) + -0.01;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      local_1f8[2] = 0.0;
      local_1f8[0] = 0.0;
      local_1f8[1] = 0.0;
      lVar18 = 0;
      do {
        local_1f8[lVar18] = *(float *)((long)pVVar10->m_data + lVar18 * 4 + lVar14) + 0.01;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      uVar6 = (long)local_1e0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1e0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pVVar15 = local_1e0.
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar6) {
        uVar13 = (uVar6 >> 2) * -0x5555555555555555;
        do {
          uVar21 = uVar13 >> 1;
          uVar22 = uVar21;
          if (pVVar15[uVar21].m_data[0] <= (float)local_1b0._0_4_ &&
              (float)local_1b0._0_4_ != pVVar15[uVar21].m_data[0]) {
            uVar22 = ~uVar21 + uVar13;
            pVVar15 = pVVar15 + uVar21 + 1;
          }
          uVar13 = uVar22;
        } while (0 < (long)uVar22);
      }
      local_1b8 = lVar14;
      if (((pVVar15 !=
            local_1e0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_finish) &&
          (uVar16 = (int)((ulong)((long)pVVar15 -
                                 (long)local_1e0.
                                       super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start) >> 2) *
                    -0x55555555, -1 < (int)uVar16)) &&
         (iVar20 = (int)(uVar6 >> 2), uVar19 = iVar20 * -0x55555555,
         SBORROW4(uVar16,uVar19) != (int)(uVar16 + iVar20 * 0x55555555) < 0)) {
        pVVar17 = local_1e0.
                  super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar16;
        do {
          if (local_1f8[0] <
              local_1e0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar16].m_data[0]) break;
          local_210[0] = '\0';
          local_210[1] = '\0';
          local_210[2] = '\0';
          lVar14 = 0;
          do {
            local_210[lVar14] = *(float *)(local_1b0 + lVar14 * 4) <= pVVar17->m_data[lVar14];
            lVar14 = lVar14 + 1;
          } while (lVar14 != 3);
          if (((local_210[0] != '\0') && (local_210[1] != '\0')) && (local_210[2] != '\0')) {
            local_214[2] = '\0';
            local_214[0] = '\0';
            local_214[1] = '\0';
            lVar14 = 0;
            do {
              local_214[lVar14] = pVVar17->m_data[lVar14] <= local_1f8[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            if (((local_214[0] != '\0') && (local_214[1] != '\0')) && (local_214[2] != '\0'))
            goto LAB_007794a7;
          }
          uVar16 = uVar16 + 1;
          pVVar17 = pVVar17 + 1;
        } while (uVar16 != uVar19);
      }
      local_20c = local_20c + 1;
      if (local_20c < 5) {
        local_1b0 = (undefined1  [8])local_1e8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Failure: no matching ",0x15);
        iVar20 = (int)(ostringstream *)&local_1a8;
        if (supersetName == (char *)0x0) {
          std::ios::clear(iVar20 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18));
        }
        else {
          sVar9 = strlen(supersetName);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,supersetName,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8," point found for ",0x11);
        pcVar4 = local_1c8;
        if (local_1c8 == (char *)0x0) {
          std::ios::clear(iVar20 + (int)*(undefined8 *)(CONCAT44(uStack_1a4,local_1a8) + -0x18));
        }
        else {
          sVar9 = strlen(local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar4,sVar9);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," point ",7);
        tcu::operator<<((ostream *)&local_1a8,local_208);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_00779458:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
      }
      else if (local_20c == 5) {
        local_1b0 = (undefined1  [8])local_1e8;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_1a8,"Note: More errors follow",0x18);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_00779458;
      }
      drawTessCoordPoint(local_1c0,local_1fc,local_208,errorColor,4);
      pVVar10 = (subset->
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
                _M_impl.super__Vector_impl_data._M_start;
      pVVar12 = (subset->
                super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>).
                _M_impl.super__Vector_impl_data._M_finish;
LAB_007794a7:
      lVar23 = lVar23 + 1;
      lVar14 = local_1b8 + 0xc;
    } while (lVar23 < (int)((ulong)((long)pVVar12 - (long)pVVar10) >> 2) * -0x55555555);
    bVar24 = local_20c == 0;
  }
  if (local_1e0.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (Vector<float,_3> *)0x0) {
    operator_delete(local_1e0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1e0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar24;
}

Assistant:

bool oneWayComparePointSets (tcu::TestLog&					log,
							 tcu::Surface&					errorDst,
							 const TessPrimitiveType		primitiveType,
							 const std::vector<tcu::Vec3>&	subset,
							 const std::vector<tcu::Vec3>&	superset,
							 const char*					subsetName,
							 const char*					supersetName,
							 const tcu::RGBA&				errorColor)
{
	const std::vector<tcu::Vec3> supersetSorted		 = sorted(superset, vec3XLessThan);
	const float					 epsilon			 = 0.01f;
	const int					 maxNumFailurePrints = 5;
	int							 numFailuresDetected = 0;

	for (int subNdx = 0; subNdx < static_cast<int>(subset.size()); ++subNdx)
	{
		const tcu::Vec3& subPt = subset[subNdx];

		bool matchFound = false;

		{
			// Binary search the index of the first point in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
			const tcu::Vec3	matchMin			= subPt - epsilon;
			const tcu::Vec3	matchMax			= subPt + epsilon;
			const int		firstCandidateNdx	= binarySearchFirstVec3WithXAtLeast(supersetSorted, matchMin.x());

			if (firstCandidateNdx >= 0)
			{
				// Compare subPt to all points in supersetSorted with x in the [subPt.x() - epsilon, subPt.x() + epsilon] range.
				for (int superNdx = firstCandidateNdx; superNdx < static_cast<int>(supersetSorted.size()) && supersetSorted[superNdx].x() <= matchMax.x(); ++superNdx)
				{
					const tcu::Vec3& superPt = supersetSorted[superNdx];

					if (tcu::boolAll(tcu::greaterThanEqual	(superPt, matchMin)) &&
						tcu::boolAll(tcu::lessThanEqual		(superPt, matchMax)))
					{
						matchFound = true;
						break;
					}
				}
			}
		}

		if (!matchFound)
		{
			++numFailuresDetected;
			if (numFailuresDetected < maxNumFailurePrints)
				log << tcu::TestLog::Message << "Failure: no matching " << supersetName << " point found for " << subsetName << " point " << subPt << tcu::TestLog::EndMessage;
			else if (numFailuresDetected == maxNumFailurePrints)
				log << tcu::TestLog::Message << "Note: More errors follow" << tcu::TestLog::EndMessage;

			drawTessCoordPoint(errorDst, primitiveType, subPt, errorColor, 4);
		}
	}

	return numFailuresDetected == 0;
}